

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

int cs::tree_type<cs::token_base_*>::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  EVP_PKEY_CTX *src_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (dst == (EVP_PKEY_CTX *)0x0) {
    src_00 = (EVP_PKEY_CTX *)0x0;
  }
  else {
    src_00 = (EVP_PKEY_CTX *)operator_new(0x20);
    *(EVP_PKEY_CTX **)src_00 = src;
    *(undefined8 *)(src_00 + 8) = 0;
    *(undefined8 *)(src_00 + 0x10) = 0;
    *(undefined8 *)(src_00 + 0x18) = *(undefined8 *)(dst + 0x18);
    iVar1 = copy(*(EVP_PKEY_CTX **)(dst + 8),src_00);
    *(ulong *)(src_00 + 8) = CONCAT44(extraout_var,iVar1);
    iVar1 = copy(*(EVP_PKEY_CTX **)(dst + 0x10),src_00);
    *(ulong *)(src_00 + 0x10) = CONCAT44(extraout_var_00,iVar1);
  }
  return (int)src_00;
}

Assistant:

static tree_node *copy(tree_node *raw, tree_node *root = nullptr)
		{
			if (raw == nullptr) return nullptr;
			tree_node *node = new tree_node(root, nullptr, nullptr, raw->data);
			node->left = copy(raw->left, node);
			node->right = copy(raw->right, node);
			return node;
		}